

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O2

plock_entry_t * plock_lock(plock *plock,void *start,void *len)

{
  size_t __size;
  int iVar1;
  list_elem *plVar2;
  plock_entry_t *__ptr;
  list_elem *plVar3;
  void *pvVar4;
  
  if (len == (void *)0x0 || (start == (void *)0x0 || plock == (plock *)0x0)) {
    return (plock_entry_t *)0x0;
  }
  (*plock->ops->lock_internal)(plock->lock);
  plVar2 = (plock->active).head;
  while (plVar2 != (list_elem *)0x0) {
    iVar1 = (*plock->ops->is_overlapped)(plVar2[-2].next,plVar2[-1].prev,start,len,plock->aux);
    if (iVar1 == 0) {
      plVar2 = plVar2->next;
    }
    else {
      *(int *)&plVar2[-1].next = *(int *)&plVar2[-1].next + 1;
      (*plock->ops->unlock_internal)(plock->lock);
      (*plock->ops->lock_user)(plVar2[-2].prev);
      (*plock->ops->lock_internal)(plock->lock);
      plVar3 = plVar2->next;
      *(int *)&plVar2[-1].next = *(int *)&plVar2[-1].next + -1;
      if (*(int *)&plVar2[-1].next == 0) {
        list_remove(&plock->active,plVar2);
        list_push_front(&plock->inactive,plVar2);
      }
      (*plock->ops->unlock_user)(plVar2[-2].prev);
      plVar2 = plVar3;
    }
  }
  plVar2 = list_pop_front(&plock->inactive);
  if (plVar2 == (list_elem *)0x0) {
    __ptr = (plock_entry_t *)malloc(0x30);
    if (__ptr != (plock_entry_t *)0x0) {
      plVar2 = (list_elem *)malloc(plock->sizeof_lock_user);
      __ptr->lock = plVar2;
      (*plock->ops->init_user)(plVar2);
      __size = plock->sizeof_range;
      plVar3 = (list_elem *)malloc(__size);
      __ptr->start = plVar3;
      pvVar4 = malloc(__size);
      __ptr->len = pvVar4;
      if ((plVar2 != (list_elem *)0x0) && (plVar3 != (list_elem *)0x0 && pvVar4 != (void *)0x0))
      goto LAB_0013c192;
      free(__ptr);
    }
    __ptr = (plock_entry_t *)0x0;
  }
  else {
    __ptr = (plock_entry_t *)(plVar2 + -2);
LAB_0013c192:
    __ptr->wcount = 0;
    memcpy((list_elem *)__ptr->start,start,plock->sizeof_range);
    memcpy(__ptr->len,len,plock->sizeof_range);
    list_push_back(&plock->active,&__ptr->le);
    (*plock->ops->lock_user)((list_elem *)__ptr->lock);
  }
  (*plock->ops->unlock_internal)(plock->lock);
  return __ptr;
}

Assistant:

plock_entry_t *plock_lock(struct plock *plock, void *start, void *len)
{
    struct list_elem *le = NULL;
    struct plock_node *node = NULL;

    if (!plock || !start || !len) {
        return NULL;
    }

    // grab plock's lock
    plock->ops->lock_internal(plock->lock);

    // find existing overlapped lock
    le = list_begin(&plock->active);
    while (le) {
        node = _get_entry(le, struct plock_node, le);
        if (plock->ops->is_overlapped(node->start, node->len,
                                      start, len, plock->aux)) {
            // overlapped
            // increase waiting count
            node->wcount++;
            // release plock's lock
            plock->ops->unlock_internal(plock->lock);

            // grab node's lock
            plock->ops->lock_user(node->lock);
            // got control .. that means the owner released the lock
            // grab plock's lock
            plock->ops->lock_internal(plock->lock);
            // decrease waiting count
            le = list_next(&node->le);
            node->wcount--;
            if (node->wcount == 0) {
                // no other thread refers this node
                // move from active to inactive
                list_remove(&plock->active, &node->le);
                list_push_front(&plock->inactive, &node->le);
            }
            // release node's lock
            plock->ops->unlock_user(node->lock);
        } else {
            le = list_next(le);
        }
    }

    // get a free lock
    le = list_pop_front(&plock->inactive);
    if (le == NULL) {
        // no free lock .. create one
        node = (struct plock_node *)malloc(sizeof(struct plock_node));
        if (!node) {
            plock->ops->unlock_internal(plock->lock);
            return NULL;
        }
        node->lock = (void *)malloc(plock->sizeof_lock_user);
        plock->ops->init_user(node->lock);
        node->start = (void *)malloc(plock->sizeof_range);
        node->len = (void *)malloc(plock->sizeof_range);
        if (!node->lock || !node->start || !node->len) {
            free(node);
            plock->ops->unlock_internal(plock->lock);
            return NULL;
        }
    } else {
        node = _get_entry(le, struct plock_node ,le);
    }
    node->wcount = 0;

    // copy start & len value
    memcpy(node->start, start, plock->sizeof_range);
    memcpy(node->len, len, plock->sizeof_range);
    // insert into active list
    list_push_back(&plock->active, &node->le);

    // grab node's lock & release plock's lock
    plock->ops->lock_user(node->lock);
    plock->ops->unlock_internal(plock->lock);

    return node;
}